

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerApp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,Seconds aTimeout)

{
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  int iVar4;
  Error *pEVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  uint8_t status;
  undefined1 local_b8 [8];
  char *local_b0;
  size_t local_a8;
  undefined8 local_a0;
  format_string_checker<char> *local_98;
  parse_func local_90 [1];
  string local_80;
  writer write;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
    local_b0 = "the commissioner is not active";
    local_a8 = 0x1e;
    local_a0._0_4_ = 0;
    local_a0._4_4_ = 0;
    local_90[0] = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_98 = (format_string_checker<char> *)local_b8;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)local_b8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_(&local_80,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_58._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_80);
  }
  else {
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x32])
              (local_b8,peVar3,&status,aMulticastAddrList,aTimeout.__r & 0xffffffff);
    pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_b8);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_b0);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    if (status == '\0') {
      return __return_storage_ptr__;
    }
    local_b8._0_4_ = uint_type;
    local_b0 = "request was rejected with statusCode={}";
    local_a8 = 0x27;
    local_a0._0_4_ = 0;
    local_a0._4_4_ = 1;
    local_90[0] = ::fmt::v10::detail::
                  parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "request was rejected with statusCode={}";
    local_98 = (format_string_checker<char> *)local_b8;
    write.handler_ = (format_string_checker<char> *)local_b8;
    while (pcVar6 != "") {
      cVar1 = *pcVar6;
      pcVar7 = pcVar6;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()(&write,pcVar6,"");
          goto LAB_0014d1a8;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
      ::writer::operator()(&write,pcVar6,pcVar7);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                         (pcVar7,"",(format_string_checker<char> *)local_b8);
    }
LAB_0014d1a8:
    local_b8 = (undefined1  [8])(ulong)status;
    fmt.size_ = 2;
    fmt.data_ = (char *)0x27;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"request was rejected with statusCode={}",fmt,args_00);
    local_58._0_4_ = kRejected;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_80);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::RegisterMulticastListener(const std::vector<std::string> &aMulticastAddrList, Seconds aTimeout)
{
    Error   error;
    uint8_t status;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->RegisterMulticastListener(status, aMulticastAddrList, aTimeout.count()));
    VerifyOrExit(status == kMlrStatusSuccess,
                 error = ERROR_REJECTED("request was rejected with statusCode={}", status));

exit:
    return error;
}